

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O2

void enter_reuse_via_separate_kvs_test(void)

{
  FILE *pFVar1;
  fdb_kvs_handle *pfVar2;
  fdb_status fVar3;
  sb_decision_t sVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *db2;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_file_info file_info;
  char keybuf [256];
  char bodybuf [512];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fconfig.compaction_threshold = '\0';
  fconfig.block_reusing_threshold = 0x23;
  fconfig.num_keeping_headers = 10;
  system("rm -rf  staleblktest* > errorlog.txt");
  fdb_open(&dbfile,"./staleblktest1",&fconfig);
  fdb_kvs_open(dbfile,&db,"db",&kvs_config);
  fdb_kvs_open(dbfile,&db2,"db2",&kvs_config);
  uVar8 = 0;
  while (uVar8 != 10) {
    sprintf(keybuf,"%dkey",(ulong)uVar8);
    fillstr(bodybuf,'a',0xc);
    pfVar2 = db;
    sVar5 = strlen(keybuf);
    sVar6 = strlen(bodybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
    pfVar2 = db2;
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x58f);
      enter_reuse_via_separate_kvs_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x58f,"void enter_reuse_via_separate_kvs_test()");
    }
    sVar5 = strlen(keybuf);
    sVar6 = strlen(bodybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x592);
      enter_reuse_via_separate_kvs_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x592,"void enter_reuse_via_separate_kvs_test()");
    }
    fVar3 = fdb_commit(dbfile,'\x01');
    pFVar1 = _stderr;
    uVar8 = uVar8 + 1;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x594);
      enter_reuse_via_separate_kvs_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x594,"void enter_reuse_via_separate_kvs_test()");
    }
  }
  uVar8 = 0;
  do {
    builtin_strncpy(keybuf,"0key",5);
    fillstr(bodybuf,'b',0x80);
    pfVar2 = db;
    sVar5 = strlen(keybuf);
    sVar6 = strlen(bodybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x59e);
      enter_reuse_via_separate_kvs_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x59e,"void enter_reuse_via_separate_kvs_test()");
    }
    fVar3 = fdb_get_file_info(dbfile,&file_info);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x5a1);
      enter_reuse_via_separate_kvs_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x5a1,"void enter_reuse_via_separate_kvs_test()");
    }
    uVar8 = uVar8 + 1;
  } while (file_info.file_size < 0x1000000);
  sVar4 = sb_check_block_reusing(db);
  if (sVar4 != SBD_RECLAIM) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x5a6);
    enter_reuse_via_separate_kvs_test()::__test_pass = 1;
    __assert_fail("sb_decision == SBD_RECLAIM",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x5a6,"void enter_reuse_via_separate_kvs_test()");
  }
  fVar3 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    uVar10 = 0;
    while (uVar8 != uVar10) {
      sprintf(keybuf,"key%d",(ulong)uVar10);
      fillstr(bodybuf,'c',0x80);
      pfVar2 = db;
      sVar5 = strlen(keybuf);
      sVar6 = strlen(bodybuf);
      fVar3 = fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
      pFVar1 = _stderr;
      uVar10 = uVar10 + 1;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar7 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x5b2);
        enter_reuse_via_separate_kvs_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x5b2,"void enter_reuse_via_separate_kvs_test()");
      }
    }
    fVar3 = fdb_commit(dbfile,'\x01');
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x5b5);
      enter_reuse_via_separate_kvs_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x5b5,"void enter_reuse_via_separate_kvs_test()");
    }
    fdb_iterator_init(db2,&iterator,(void *)0x0,0,(void *)0x0,0,0);
    iVar9 = 10;
    do {
      fVar3 = fdb_iterator_get(iterator,&rdoc);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x5bc);
        enter_reuse_via_separate_kvs_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x5bc,"void enter_reuse_via_separate_kvs_test()");
      }
      fdb_doc_free(rdoc);
      rdoc = (fdb_doc *)0x0;
      fVar3 = fdb_iterator_next(iterator);
      iVar9 = iVar9 + -1;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if (iVar9 == 0) {
      fdb_iterator_close(iterator);
      fVar3 = fdb_kvs_close(db);
      pFVar1 = _stderr;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar7 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x5c5);
        enter_reuse_via_separate_kvs_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x5c5,"void enter_reuse_via_separate_kvs_test()");
      }
      fVar3 = fdb_kvs_close(db2);
      pFVar1 = _stderr;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        fVar3 = fdb_close(dbfile);
        pFVar1 = _stderr;
        if (fVar3 == FDB_RESULT_SUCCESS) {
          fdb_shutdown();
          memleak_end();
          pcVar7 = "%s PASSED\n";
          if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
            pcVar7 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar7,"enter reuse via separate kvs test");
          return;
        }
        pcVar7 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x5c9);
        enter_reuse_via_separate_kvs_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x5c9,"void enter_reuse_via_separate_kvs_test()");
      }
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x5c7);
      enter_reuse_via_separate_kvs_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x5c7,"void enter_reuse_via_separate_kvs_test()");
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x5c1);
    enter_reuse_via_separate_kvs_test()::__test_pass = 1;
    __assert_fail("i==10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x5c1,"void enter_reuse_via_separate_kvs_test()");
  }
  pcVar7 = fdb_error_msg(fVar3);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x5aa);
  enter_reuse_via_separate_kvs_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x5aa,"void enter_reuse_via_separate_kvs_test()");
}

Assistant:

void enter_reuse_via_separate_kvs_test() {
    TEST_INIT();
    memleak_start();

    int i, r, ndocs;
    int nheaders = 10;
    char keybuf[256];
    char bodybuf[512];

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *db2;
    fdb_doc *rdoc = NULL;
    fdb_iterator *iterator;
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 35;
    fconfig.num_keeping_headers = nheaders;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    fdb_kvs_open(dbfile, &db2, "db2", &kvs_config);

    // load docs into db and db2
    for (i = 0; i < nheaders; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'a', 12);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_set_kv(db2, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // enter reuse via db
    i = 0;
    do {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'b', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    ndocs = i;

    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // reuse blocks
    for (i = 0; i < ndocs; i++) {
        sprintf(keybuf, "key%d", i);
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // check that docs from db2 not lost
    fdb_iterator_init(db2, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    i = 0;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);
    fdb_iterator_close(iterator);

    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_kvs_close(db2);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("enter reuse via separate kvs test");
}